

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

string * __thiscall
Jupiter::Socket::resolveHostname_abi_cxx11_
          (string *__return_storage_ptr__,Socket *this,char *hostname,uint result)

{
  addrinfo **__pai;
  addrinfo *ptr;
  addrinfo *local_20;
  
  __pai = &local_20;
  local_20 = (addrinfo *)0x0;
  getaddrinfo((char *)this,(char *)0x0,(addrinfo *)0x0,__pai);
  if (local_20 == (addrinfo *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    resolveHostname_abi_cxx11_
              (__return_storage_ptr__,(Socket *)local_20,(addrinfo *)((ulong)hostname & 0xffffffff),
               (uint)__pai);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Jupiter::Socket::resolveHostname(const char *hostname, unsigned int result) { // static
	addrinfo *info = Jupiter::Socket::getAddrInfo(hostname, 0);
	if (info == nullptr) {
		return {};
	}

	return Jupiter::Socket::resolveHostname(info, result);
}